

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O3

void __thiscall SkipList::Remove(SkipList *this,int inKey)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  Node *pNVar3;
  pointer pcVar4;
  Node *pNVar5;
  Node *nodeCopy;
  
  pNVar5 = Find(this,inKey);
  if (pNVar5 != (Node *)0x0) {
    if (pNVar5->top != (Node *)0x0) {
      __assert_fail("(node->top == nullptr) && \"Found node is not at the top level!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_3_data_and_algorithms/ch_18/p3ch18ex11.cpp"
                    ,0xe6,"void SkipList::Remove(int)");
    }
    if (1 < pNVar5->key + 0x80000001U) {
      do {
        pNVar2 = pNVar5->prev;
        pNVar3 = pNVar5->next;
        pNVar2->next = pNVar3;
        pNVar3->prev = pNVar2;
        pNVar2 = pNVar5->bot;
        pcVar4 = (pNVar5->val)._M_dataplus._M_p;
        paVar1 = &(pNVar5->val).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pNVar5,0x48);
        pNVar5 = pNVar2;
      } while (pNVar2 != (Node *)0x0);
      this->size = this->size + -1;
    }
  }
  return;
}

Assistant:

void SkipList::Remove(int inKey)
{
	Node* node = Find(inKey);
	if (node)
	{
		assert((node->top == nullptr) && "Found node is not at the top level!");
		if (node->key == TRAILER_KEY || node->key == HEADER_KEY)
		{
			return;
		}
		while(node)
		{
			Node* nodeCopy = node;
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node = node->bot;
			delete nodeCopy;
		}
		--size;
	}
}